

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O0

void __thiscall
phosg::Image::draw_text(Image *this,ssize_t x,ssize_t y,uint32_t color,char *fmt,...)

{
  char in_AL;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_118 [40];
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined1 local_58 [8];
  va_list va;
  char *fmt_local;
  uint32_t color_local;
  ssize_t y_local;
  ssize_t x_local;
  Image *this_local;
  
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  va[0].overflow_arg_area = local_118;
  va[0]._0_8_ = &stack0x00000008;
  local_58._4_4_ = 0x30;
  local_58._0_4_ = 0x28;
  local_f0 = in_R9;
  draw_text_v(this,x,y,(ssize_t *)0x0,(ssize_t *)0x0,(ulong)(color >> 0x18),
              (ulong)(color >> 0x10 & 0xff),(ulong)(byte)(color >> 8),(ulong)(color & 0xff),0,0,0,0,
              fmt,(__va_list_tag *)local_58);
  return;
}

Assistant:

void Image::draw_text(ssize_t x, ssize_t y, uint32_t color, const char* fmt, ...) {
  va_list va;
  va_start(va, fmt);
  try {
    this->draw_text_v(x, y, nullptr, nullptr,
        (color >> 24) & 0xFF, (color >> 16) & 0xFF, (color >> 8) & 0xFF, color & 0xFF,
        0, 0, 0, 0, fmt, va);
  } catch (...) {
    va_end(va);
    throw;
  }
  va_end(va);
}